

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_sniffer.cpp
# Opt level: O2

void duckdb::MatchAndReplaceUserSetVariables
               (DialectOptions *original,DialectOptions *sniffed,string *error,bool found_date,
               bool found_timestamp)

{
  mapped_type *pmVar1;
  mapped_type *pmVar2;
  allocator local_53;
  allocator local_52;
  key_type local_51;
  string local_50;
  
  ::std::__cxx11::string::string((string *)&local_50,"Header",&local_53);
  MatchAndReplace<bool>(&original->header,&sniffed->header,&local_50,error);
  ::std::__cxx11::string::~string((string *)&local_50);
  if ((sniffed->state_machine_options).new_line.value != NOT_SET) {
    ::std::__cxx11::string::string((string *)&local_50,"New Line",&local_53);
    MatchAndReplace<duckdb::NewLineIdentifier>
              (&(original->state_machine_options).new_line,
               &(sniffed->state_machine_options).new_line,&local_50,error);
    ::std::__cxx11::string::~string((string *)&local_50);
  }
  ::std::__cxx11::string::string((string *)&local_50,"Skip Rows",&local_53);
  MatchAndReplace<unsigned_long>(&original->skip_rows,&sniffed->skip_rows,&local_50,error);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::string((string *)&local_50,"Delimiter",&local_53);
  MatchAndReplace<std::__cxx11::string>
            ((CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)original,
             (CSVOption<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)sniffed,&local_50,error);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::string((string *)&local_50,"Quote",&local_53);
  MatchAndReplace<char>
            (&(original->state_machine_options).quote,&(sniffed->state_machine_options).quote,
             &local_50,error);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::string((string *)&local_50,"Escape",&local_53);
  MatchAndReplace<char>
            (&(original->state_machine_options).escape,&(sniffed->state_machine_options).escape,
             &local_50,error);
  ::std::__cxx11::string::~string((string *)&local_50);
  ::std::__cxx11::string::string((string *)&local_50,"Comment",&local_53);
  MatchAndReplace<char>
            (&(original->state_machine_options).comment,&(sniffed->state_machine_options).comment,
             &local_50,error);
  ::std::__cxx11::string::~string((string *)&local_50);
  if (found_date) {
    local_53 = (allocator)0xf;
    pmVar1 = ::std::
             map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
             ::operator[](&original->date_format,(key_type *)&local_53);
    local_51 = DATE;
    pmVar2 = ::std::
             map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
             ::operator[](&sniffed->date_format,&local_51);
    ::std::__cxx11::string::string((string *)&local_50,"Date Format",&local_52);
    MatchAndReplace<duckdb::StrpTimeFormat>(pmVar1,pmVar2,&local_50,error);
    ::std::__cxx11::string::~string((string *)&local_50);
  }
  if (found_timestamp) {
    local_53 = (allocator)0x13;
    pmVar1 = ::std::
             map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
             ::operator[](&original->date_format,(key_type *)&local_53);
    local_51 = TIMESTAMP;
    pmVar2 = ::std::
             map<duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>,_std::less<duckdb::LogicalTypeId>,_std::allocator<std::pair<const_duckdb::LogicalTypeId,_duckdb::CSVOption<duckdb::StrpTimeFormat>_>_>_>
             ::operator[](&sniffed->date_format,&local_51);
    ::std::__cxx11::string::string((string *)&local_50,"Timestamp Format",&local_52);
    MatchAndReplace<duckdb::StrpTimeFormat>(pmVar1,pmVar2,&local_50,error);
    ::std::__cxx11::string::~string((string *)&local_50);
  }
  return;
}

Assistant:

void MatchAndReplaceUserSetVariables(DialectOptions &original, DialectOptions &sniffed, string &error, bool found_date,
                                     bool found_timestamp) {
	MatchAndReplace(original.header, sniffed.header, "Header", error);
	if (sniffed.state_machine_options.new_line.GetValue() != NewLineIdentifier::NOT_SET) {
		// Is sniffed line is not set (e.g., single-line file) , we don't try to replace and match.
		MatchAndReplace(original.state_machine_options.new_line, sniffed.state_machine_options.new_line, "New Line",
		                error);
	}
	MatchAndReplace(original.skip_rows, sniffed.skip_rows, "Skip Rows", error);
	MatchAndReplace(original.state_machine_options.delimiter, sniffed.state_machine_options.delimiter, "Delimiter",
	                error);
	MatchAndReplace(original.state_machine_options.quote, sniffed.state_machine_options.quote, "Quote", error);
	MatchAndReplace(original.state_machine_options.escape, sniffed.state_machine_options.escape, "Escape", error);
	MatchAndReplace(original.state_machine_options.comment, sniffed.state_machine_options.comment, "Comment", error);
	if (found_date) {
		MatchAndReplace(original.date_format[LogicalTypeId::DATE], sniffed.date_format[LogicalTypeId::DATE],
		                "Date Format", error);
	}
	if (found_timestamp) {
		MatchAndReplace(original.date_format[LogicalTypeId::TIMESTAMP], sniffed.date_format[LogicalTypeId::TIMESTAMP],
		                "Timestamp Format", error);
	}
}